

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

cmValue __thiscall
cmGeneratorTarget::GetFilePrefixInternal
          (cmGeneratorTarget *this,string *config,ArtifactType artifact,string *language)

{
  size_type sVar1;
  cmMakefile *this_00;
  bool bVar2;
  TargetType TVar3;
  cmValue cVar4;
  char *__s;
  long lVar5;
  _Alloc_hider _Var6;
  ArtifactType artifact_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string langPrefix;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  char *local_58;
  undefined8 local_50;
  size_type local_48;
  pointer local_40;
  undefined8 local_38;
  
  TVar3 = cmTarget::GetType(this->Target);
  if (((((TVar3 != STATIC_LIBRARY) &&
        (TVar3 = cmTarget::GetType(this->Target), TVar3 != SHARED_LIBRARY)) &&
       (TVar3 = cmTarget::GetType(this->Target), TVar3 != MODULE_LIBRARY)) &&
      (TVar3 = cmTarget::GetType(this->Target), TVar3 != EXECUTABLE)) ||
     ((artifact == ImportLibraryArtifact && (bVar2 = NeedImportLibraryName(this,config), !bVar2))))
  {
    return (cmValue)(string *)0x0;
  }
  TVar3 = cmTarget::GetType(this->Target);
  artifact_00 = artifact;
  if ((TVar3 != SHARED_LIBRARY) &&
     (TVar3 = cmTarget::GetType(this->Target), TVar3 != MODULE_LIBRARY)) {
    TVar3 = cmTarget::GetType(this->Target);
    artifact_00 = RuntimeBinaryArtifact;
    if (TVar3 == EXECUTABLE) {
      artifact_00 = artifact;
    }
  }
  if (artifact == ImportLibraryArtifact) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_98.field_2._M_allocated_capacity._0_5_ = 0x524f504d49;
    local_98.field_2._M_allocated_capacity._5_3_ = 0x505f54;
    local_98.field_2._8_5_ = 0x5849464552;
    local_98._M_string_length = 0xd;
    local_98.field_2._M_local_buf[0xd] = '\0';
    cVar4 = GetProperty(this,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_005f9404;
    lVar5 = CONCAT35(local_98.field_2._M_allocated_capacity._5_3_,
                     local_98.field_2._M_allocated_capacity._0_5_);
    _Var6._M_p = local_98._M_dataplus._M_p;
  }
  else {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_b8.field_2._M_allocated_capacity._0_4_ = 0x46455250;
    local_b8.field_2._M_allocated_capacity._4_2_ = 0x5849;
    local_b8._M_string_length = 6;
    local_b8.field_2._M_local_buf[6] = '\0';
    cVar4 = GetProperty(this,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == &local_b8.field_2) goto LAB_005f9404;
    lVar5 = CONCAT17(local_b8.field_2._M_local_buf[7],
                     CONCAT16(local_b8.field_2._M_local_buf[6],
                              CONCAT24(local_b8.field_2._M_allocated_capacity._4_2_,
                                       local_b8.field_2._M_allocated_capacity._0_4_)));
    _Var6._M_p = local_b8._M_dataplus._M_p;
  }
  operator_delete(_Var6._M_p,lVar5 + 1);
LAB_005f9404:
  if (cVar4.Value == (string *)0x0) {
    __s = cmTarget::GetPrefixVariableInternal(this->Target,artifact_00);
    sVar1 = language->_M_string_length;
    if ((__s != (char *)0x0 && sVar1 != 0) && (*__s != '\0')) {
      local_78._M_dataplus._M_p = (pointer)strlen(__s);
      local_78.field_2._M_allocated_capacity = 0;
      local_78.field_2._8_8_ = 1;
      local_58 = "_";
      local_50 = 0;
      local_40 = (language->_M_dataplus)._M_p;
      local_38 = 0;
      views._M_len = 3;
      views._M_array = (iterator)&local_78;
      local_78._M_string_length = (size_type)__s;
      local_48 = sVar1;
      cmCatViews(&local_d8,views);
      cVar4 = cmMakefile::GetDefinition(this->Makefile,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((__s != (char *)0x0) && (cVar4.Value == (string *)0x0)) {
      this_00 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,__s,(allocator<char> *)&local_d8);
      cVar4 = cmMakefile::GetDefinition(this_00,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return (cmValue)cVar4.Value;
}

Assistant:

cmValue cmGeneratorTarget::GetFilePrefixInternal(
  std::string const& config, cmStateEnums::ArtifactType artifact,
  const std::string& language) const
{
  // no prefix for non-main target types.
  if (this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    return nullptr;
  }

  const bool isImportedLibraryArtifact =
    (artifact == cmStateEnums::ImportLibraryArtifact);

  // Return an empty prefix for the import library if this platform
  // does not support import libraries.
  if (isImportedLibraryArtifact && !this->NeedImportLibraryName(config)) {
    return nullptr;
  }

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    artifact = cmStateEnums::RuntimeBinaryArtifact;
  }

  // Compute prefix value.
  cmValue targetPrefix =
    (isImportedLibraryArtifact ? this->GetProperty("IMPORT_PREFIX")
                               : this->GetProperty("PREFIX"));

  if (!targetPrefix) {
    const char* prefixVar = this->Target->GetPrefixVariableInternal(artifact);
    if (!language.empty() && cmNonempty(prefixVar)) {
      std::string langPrefix = cmStrCat(prefixVar, "_", language);
      targetPrefix = this->Makefile->GetDefinition(langPrefix);
    }

    // if there is no prefix on the target nor specific language
    // use the cmake definition.
    if (!targetPrefix && prefixVar) {
      targetPrefix = this->Makefile->GetDefinition(prefixVar);
    }
  }

  return targetPrefix;
}